

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.cpp
# Opt level: O3

void __thiscall libtorrent::aux::chained_buffer::clear(chained_buffer *this)

{
  _Elt_pointer pbVar1;
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  *__range2;
  _Map_pointer ppbVar2;
  _Elt_pointer pbVar3;
  buffer_t *b;
  _Elt_pointer pbVar4;
  
  pbVar4 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar1 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar4 != pbVar1) {
    pbVar3 = (this->m_vec).
             super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar2 = (this->m_vec).
              super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*pbVar4->destruct_holder)(&pbVar4->holder);
      pbVar4 = pbVar4 + 1;
      if (pbVar4 == pbVar3) {
        pbVar4 = ppbVar2[1];
        ppbVar2 = ppbVar2 + 1;
        pbVar3 = pbVar4 + 8;
      }
    } while (pbVar4 != pbVar1);
  }
  this->m_bytes = 0;
  this->m_capacity = 0;
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::clear(&this->m_vec);
  return;
}

Assistant:

void chained_buffer::clear()
	{
		TORRENT_ASSERT(!m_destructed);
		for (auto& b : m_vec)
			b.destruct_holder(static_cast<void*>(&b.holder));
		m_bytes = 0;
		m_capacity = 0;
		m_vec.clear();
	}